

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecognitionException.cpp
# Opt level: O2

string * __thiscall
antlr::RecognitionException::toString_abi_cxx11_
          (string *__return_storage_ptr__,RecognitionException *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  (*(this->super_ANTLRException)._vptr_ANTLRException[7])(&local_30);
  (*(this->super_ANTLRException)._vptr_ANTLRException[3])(&local_50,this);
  std::operator+(__return_storage_ptr__,&local_30,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

string RecognitionException::toString() const
{
	return getFileLineColumnString()+getMessage();
}